

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

int ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                 void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                 float scale_max,ImVec2 frame_size)

{
  ImVec2 *p;
  ImGuiWindow *this;
  undefined1 auVar1 [12];
  ImU32 IVar2;
  ImVec2 p_max;
  ImGuiContext *pIVar3;
  void *pvVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  int iVar7;
  ImU32 IVar8;
  uint uVar9;
  int iVar11;
  int iVar12;
  ImGuiContext *g;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ImVec2 IVar17;
  ImVec2 pos;
  float fVar18;
  float fVar19;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar20;
  undefined8 uVar22;
  undefined1 auVar21 [16];
  float fVar23;
  float local_128;
  ImVec2 local_110;
  undefined1 local_108 [16];
  void *local_f0;
  float local_e8;
  ulong local_d8;
  ImVec2 pos0;
  ImRect inner_bb;
  ImRect frame_bb;
  ImRect total_bb;
  ulong uVar10;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_108._8_4_ = in_XMM2_Dc;
    local_108._0_8_ = frame_size;
    local_108._12_4_ = in_XMM2_Dd;
    local_f0 = data;
    local_e8 = scale_max;
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar17 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uVar22 = local_108._8_8_;
    if ((local_108._0_4_ == 0.0) && (!NAN(local_108._0_4_))) {
      fVar13 = CalcItemWidth();
      auVar1._4_8_ = uVar22;
      auVar1._0_4_ = local_108._4_4_;
      auVar21._0_8_ = auVar1._0_8_ << 0x20;
      auVar21._8_4_ = local_108._8_4_;
      auVar21._12_4_ = local_108._12_4_;
      local_108._4_12_ = auVar21._4_12_;
      local_108._0_4_ = fVar13;
    }
    fVar18 = local_108._4_4_;
    fVar13 = IVar17.x;
    if ((fVar18 != 0.0) || (NAN(fVar18))) {
      fVar15 = (pIVar3->Style).FramePadding.y;
    }
    else {
      fVar15 = (pIVar3->Style).FramePadding.y;
      fVar18 = fVar15 + fVar15 + IVar17.y;
      local_108._4_4_ = fVar18;
    }
    frame_bb.Min.x = (this->DC).CursorPos.x;
    frame_bb.Min.y = (this->DC).CursorPos.y;
    frame_bb.Max.x = local_108._0_4_ + frame_bb.Min.x;
    frame_bb.Max.y = fVar18 + frame_bb.Min.y;
    fVar18 = (pIVar3->Style).FramePadding.x;
    inner_bb.Min.x = fVar18 + frame_bb.Min.x;
    inner_bb.Min.y = frame_bb.Min.y + fVar15;
    inner_bb.Max.x = frame_bb.Max.x - fVar18;
    inner_bb.Max.y = frame_bb.Max.y - fVar15;
    fVar18 = 0.0;
    if (0.0 < fVar13) {
      fVar18 = (pIVar3->Style).ItemInnerSpacing.x + fVar13;
    }
    total_bb.Max.x = frame_bb.Max.x + fVar18;
    total_bb.Max.y = frame_bb.Max.y + 0.0;
    total_bb.Min.x = frame_bb.Min.x;
    total_bb.Min.y = frame_bb.Min.y;
    ItemSize(&total_bb,fVar15);
    bVar5 = ItemAdd(&total_bb,0,&frame_bb);
    if (bVar5) {
      bVar5 = ItemHoverable(&frame_bb,id);
      if (((scale_min == 3.4028235e+38) && (!NAN(scale_min))) ||
         ((local_128 = scale_min, local_e8 == 3.4028235e+38 && (!NAN(local_e8))))) {
        iVar11 = 0;
        iVar7 = 0;
        if (0 < values_count) {
          iVar7 = values_count;
        }
        fVar18 = 3.4028235e+38;
        fVar15 = -3.4028235e+38;
        for (; iVar7 != iVar11; iVar11 = iVar11 + 1) {
          fVar14 = (*values_getter)(local_f0,iVar11);
          if (!NAN(fVar14)) {
            if (fVar14 <= fVar18) {
              fVar18 = fVar14;
            }
            fVar15 = (float)((uint)fVar15 & -(uint)(fVar14 <= fVar15) |
                            ~-(uint)(fVar14 <= fVar15) & (uint)fVar14);
          }
        }
        local_128 = (float)(~-(uint)(scale_min == 3.4028235e+38) & (uint)scale_min |
                           (uint)fVar18 & -(uint)(scale_min == 3.4028235e+38));
        local_e8 = (float)(~-(uint)(local_e8 == 3.4028235e+38) & (uint)local_e8 |
                          (uint)fVar15 & -(uint)(local_e8 == 3.4028235e+38));
      }
      IVar17.y = frame_bb.Min.y;
      IVar17.x = frame_bb.Min.x;
      p_max.y = frame_bb.Max.y;
      p_max.x = frame_bb.Max.x;
      IVar6 = GetColorU32(7,1.0);
      RenderFrame(IVar17,p_max,IVar6,true,(pIVar3->Style).FrameRounding);
      if (values_count < (int)((plot_type == ImGuiPlotType_Lines) + 1)) {
        iVar7 = -1;
      }
      else {
        iVar7 = (int)(float)local_108._0_4_;
        if (values_count <= (int)(float)local_108._0_4_) {
          iVar7 = values_count;
        }
        iVar11 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
        uVar10 = 0xffffffffffffffff;
        if (bVar5) {
          p = &(pIVar3->IO).MousePos;
          bVar5 = ImRect::Contains(&inner_bb,p);
          pvVar4 = local_f0;
          if (bVar5) {
            fVar15 = (p->x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x);
            fVar18 = 0.9999;
            if (fVar15 <= 0.9999) {
              fVar18 = fVar15;
            }
            uVar9 = (uint)((float)iVar11 * (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar18));
            uVar10 = (ulong)uVar9;
            if (((int)uVar9 < 0) || (values_count <= (int)uVar9)) {
              __assert_fail("v_idx >= 0 && v_idx < values_count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                            ,0x189b,
                            "int ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                           );
            }
            fVar18 = (*values_getter)(local_f0,(int)(values_offset + uVar9) % values_count);
            local_108._0_4_ = fVar18;
            (*values_getter)(pvVar4,(int)(values_offset + uVar9 + 1) % values_count);
            if (plot_type == ImGuiPlotType_Lines) {
              SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar9,(ulong)(uVar9 + 1));
            }
            else if (plot_type == ImGuiPlotType_Histogram) {
              SetTooltip("%d: %8.4g",(double)(float)local_108._0_4_,uVar10);
            }
          }
        }
        iVar7 = iVar7 - (uint)(plot_type == ImGuiPlotType_Lines);
        local_108 = ZEXT416(~-(uint)(local_128 == local_e8) & (uint)(1.0 / (local_e8 - local_128)));
        fVar18 = (*values_getter)(local_f0,values_offset % values_count);
        fVar15 = (fVar18 - local_128) * (float)local_108._0_4_;
        fVar18 = 1.0;
        if (fVar15 <= 1.0) {
          fVar18 = fVar15;
        }
        if (0.0 <= local_e8 * local_128) {
          fVar14 = (float)(~-(uint)(local_128 < 0.0) & 0x3f800000);
        }
        else {
          fVar14 = -local_128 * (float)local_108._0_4_;
        }
        local_d8 = uVar10;
        IVar6 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26,1.0);
        IVar8 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x27,1.0);
        local_e8 = (float)iVar11;
        iVar11 = 0;
        if (0 < iVar7) {
          iVar11 = iVar7;
        }
        fVar19 = 0.0;
        fVar18 = (float)(-(uint)(fVar15 < 0.0) & 0x3f800000 |
                        ~-(uint)(fVar15 < 0.0) & (uint)(1.0 - fVar18));
        while (bVar5 = iVar11 != 0, iVar11 = iVar11 + -1, bVar5) {
          iVar12 = (int)(fVar19 * local_e8 + 0.5);
          if ((iVar12 < 0) || (values_count <= iVar12)) {
            __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                          ,0x18b5,
                          "int ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          fVar16 = 1.0 / (float)iVar7 + fVar19;
          fVar15 = (*values_getter)(local_f0,(values_offset + 1 + iVar12) % values_count);
          fVar20 = (fVar15 - local_128) * (float)local_108._0_4_;
          fVar15 = 1.0;
          if (fVar20 <= 1.0) {
            fVar15 = fVar20;
          }
          fVar20 = (float)(-(uint)(fVar20 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar20 < 0.0) & (uint)(1.0 - fVar15));
          fVar15 = inner_bb.Max.y - inner_bb.Min.y;
          fVar23 = fVar19 * (inner_bb.Max.x - inner_bb.Min.x) + inner_bb.Min.x;
          pos0.y = fVar18 * fVar15 + inner_bb.Min.y;
          pos0.x = fVar23;
          local_110.x = (inner_bb.Max.x - inner_bb.Min.x) * fVar16 + inner_bb.Min.x;
          fVar19 = fVar16;
          fVar18 = fVar20;
          if (plot_type == ImGuiPlotType_Lines) {
            local_110.y = fVar15 * fVar20 + inner_bb.Min.y;
            IVar2 = IVar6;
            if ((int)local_d8 == iVar12) {
              IVar2 = IVar8;
            }
            ImDrawList::AddLine(this->DrawList,&pos0,&local_110,IVar2,1.0);
          }
          else {
            local_110.y = fVar15 * fVar14 + inner_bb.Min.y;
            if (plot_type == ImGuiPlotType_Histogram) {
              if (fVar23 + 2.0 <= local_110.x) {
                local_110.x = local_110.x + -1.0;
              }
              IVar2 = IVar6;
              if ((int)local_d8 == iVar12) {
                IVar2 = IVar8;
              }
              ImDrawList::AddRectFilled(this->DrawList,&pos0,&local_110,IVar2,0.0,0xf);
            }
          }
        }
        iVar7 = (int)local_d8;
      }
      if (overlay_text != (char *)0x0) {
        pos0.y = frame_bb.Min.y + (pIVar3->Style).FramePadding.y;
        pos0.x = frame_bb.Min.x;
        local_110.x = 0.5;
        local_110.y = 0.0;
        RenderTextClipped(&pos0,&frame_bb.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_110,
                          (ImRect *)0x0);
      }
      if (fVar13 <= 0.0) {
        return iVar7;
      }
      pos.x = frame_bb.Max.x + (pIVar3->Style).ItemInnerSpacing.x;
      pos.y = inner_bb.Min.y;
      RenderText(pos,label,(char *)0x0,true);
      return iVar7;
    }
  }
  return -1;
}

Assistant:

int ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return -1;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return -1;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    int idx_hovered = -1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx + 1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            idx_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f, 0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    // Return hovered index or -1 if none are hovered.
    // This is currently not exposed in the public API because we need a larger redesign of the whole thing, but in the short-term we are making it available in PlotEx().
    return idx_hovered;
}